

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O2

void __thiscall CoreML::OneHotEncoder::OneHotEncoder(OneHotEncoder *this,string *description)

{
  Model::Model(&this->super_Model,description);
  (this->super_Model)._vptr_Model = (_func_int **)&PTR__Model_0039ec58;
  Specification::Model::mutable_onehotencoder
            ((this->super_Model).m_spec.
             super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

OneHotEncoder::OneHotEncoder(const std::string& description) :
    Model(description) {
        // make sure we become a one hot encoder
        (void) m_spec->mutable_onehotencoder();
    }